

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O3

void __thiscall
booster::locale::basic_message<char>::basic_message
          (basic_message<char> *this,basic_message<char> *other)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  this->n_ = other->n_;
  uVar2 = *(undefined4 *)((long)&other->c_id_ + 4);
  uVar3 = *(undefined4 *)&other->c_context_;
  uVar4 = *(undefined4 *)((long)&other->c_context_ + 4);
  *(undefined4 *)&this->c_id_ = *(undefined4 *)&other->c_id_;
  *(undefined4 *)((long)&this->c_id_ + 4) = uVar2;
  *(undefined4 *)&this->c_context_ = uVar3;
  *(undefined4 *)((long)&this->c_context_ + 4) = uVar4;
  this->c_plural_ = other->c_plural_;
  (this->id_)._M_dataplus._M_p = (pointer)&(this->id_).field_2;
  pcVar1 = (other->id_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->id_,pcVar1,pcVar1 + (other->id_)._M_string_length);
  (this->context_)._M_dataplus._M_p = (pointer)&(this->context_).field_2;
  pcVar1 = (other->context_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->context_,pcVar1,pcVar1 + (other->context_)._M_string_length);
  (this->plural_)._M_dataplus._M_p = (pointer)&(this->plural_).field_2;
  pcVar1 = (other->plural_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->plural_,pcVar1,pcVar1 + (other->plural_)._M_string_length);
  return;
}

Assistant:

basic_message(basic_message const &other) :
                n_(other.n_),
                c_id_(other.c_id_),
                c_context_(other.c_context_),
                c_plural_(other.c_plural_),
                id_(other.id_),
                context_(other.context_),
                plural_(other.plural_)
            {
            }